

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O1

ShaderSourceFileData *
Diligent::ReadShaderSourceFile
          (ShaderSourceFileData *__return_storage_ptr__,char *SourceCode,size_t SourceLength,
          IShaderSourceInputStreamFactory *pShaderSourceStreamFactory,char *FilePath)

{
  IDataBlob *pIVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  string msg;
  undefined1 local_48 [8];
  undefined1 local_40 [32];
  char *local_20;
  
  (__return_storage_ptr__->pFileData).m_pObject = (IDataBlob *)0x0;
  __return_storage_ptr__->Source = (char *)0x0;
  __return_storage_ptr__->SourceLength = 0;
  local_20 = FilePath;
  if (SourceCode == (char *)0x0) {
    if (pShaderSourceStreamFactory == (IShaderSourceInputStreamFactory *)0x0) {
      FormatString<char[29]>((string *)local_40,(char (*) [29])"Input stream factory is null");
      DebugAssertionFailed
                ((Char *)local_40._0_8_,"ReadShaderSourceFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                 ,0x101);
    }
    else {
      if (FilePath != (char *)0x0) {
        local_40._8_8_ = local_48;
        local_48 = (undefined1  [8])0x0;
        local_40._0_8_ = (pointer)0x0;
        (*(pShaderSourceStreamFactory->super_IObject)._vptr_IObject[4])(pShaderSourceStreamFactory);
        RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::
        ~DoublePtrHelper((DoublePtrHelper<Diligent::IFileStream> *)local_40);
        if (local_48 == (undefined1  [8])0x0) {
          local_40[0] = 0x27;
          LogError<true,char[36],char_const*,char>
                    (false,"ReadShaderSourceFile",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                     ,0xf3,(char (*) [36])"Failed to load shader source file \'",&local_20,
                     (char *)local_40);
        }
        DataBlobImpl::Create((DataBlobImpl *)local_40,0,(void *)0x0);
        RefCntAutoPtr<Diligent::IDataBlob>::operator=
                  (&__return_storage_ptr__->pFileData,
                   (RefCntAutoPtr<Diligent::DataBlobImpl> *)local_40);
        RefCntAutoPtr<Diligent::DataBlobImpl>::Release
                  ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_40);
        (**(code **)(*(long *)local_48 + 0x28))
                  (local_48,(__return_storage_ptr__->pFileData).m_pObject);
        pIVar1 = (__return_storage_ptr__->pFileData).m_pObject;
        iVar3 = (*(pIVar1->super_IObject)._vptr_IObject[7])(pIVar1,0);
        __return_storage_ptr__->Source = (char *)CONCAT44(extraout_var,iVar3);
        iVar3 = (*(((__return_storage_ptr__->pFileData).m_pObject)->super_IObject)._vptr_IObject[5])
                          ();
        local_40._0_8_ = CONCAT44(extraout_var_00,iVar3);
        uVar2 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)local_40);
        __return_storage_ptr__->SourceLength = uVar2;
        if (local_48 == (undefined1  [8])0x0) {
          return __return_storage_ptr__;
        }
        (**(code **)(*(long *)local_48 + 0x10))();
        return __return_storage_ptr__;
      }
      FormatString<char[17]>((string *)local_40,(char (*) [17])"FilePath is null");
      DebugAssertionFailed
                ((Char *)local_40._0_8_,"ReadShaderSourceFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                 ,0xfc);
    }
    if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
      operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
    }
  }
  else {
    if (FilePath != (char *)0x0) {
      FormatString<char[50]>
                ((string *)local_40,
                 (char (*) [50])"FilePath must be null when SourceCode is not null");
      DebugAssertionFailed
                ((Char *)local_40._0_8_,"ReadShaderSourceFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                 ,0xe6);
      if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
        operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
      }
    }
    __return_storage_ptr__->Source = SourceCode;
    if (SourceLength == 0) {
      SourceLength = strlen(SourceCode);
    }
    local_40._0_8_ = SourceLength;
    uVar2 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)local_40);
    __return_storage_ptr__->SourceLength = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderSourceFileData ReadShaderSourceFile(const char*                      SourceCode,
                                          size_t                           SourceLength,
                                          IShaderSourceInputStreamFactory* pShaderSourceStreamFactory,
                                          const char*                      FilePath) noexcept(false)
{
    ShaderSourceFileData SourceData;
    if (SourceCode != nullptr)
    {
        VERIFY(FilePath == nullptr, "FilePath must be null when SourceCode is not null");
        SourceData.Source       = SourceCode;
        SourceData.SourceLength = StaticCast<Uint32>(SourceLength != 0 ? SourceLength : strlen(SourceCode));
    }
    else
    {
        if (pShaderSourceStreamFactory != nullptr)
        {
            if (FilePath != nullptr)
            {
                RefCntAutoPtr<IFileStream> pSourceStream;
                pShaderSourceStreamFactory->CreateInputStream(FilePath, &pSourceStream);
                if (pSourceStream == nullptr)
                    LOG_ERROR_AND_THROW("Failed to load shader source file '", FilePath, '\'');

                SourceData.pFileData = DataBlobImpl::Create();
                pSourceStream->ReadBlob(SourceData.pFileData);
                SourceData.Source       = SourceData.pFileData->GetConstDataPtr<char>();
                SourceData.SourceLength = StaticCast<Uint32>(SourceData.pFileData->GetSize());
            }
            else
            {
                UNEXPECTED("FilePath is null");
            }
        }
        else
        {
            UNEXPECTED("Input stream factory is null");
        }
    }

    return SourceData;
}